

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::focusOutEvent(QWidget *this,QFocusEvent *param_2)

{
  bool bVar1;
  FocusPolicy FVar2;
  QCoreApplication *this_00;
  QWidget *in_RSI;
  QWidget *in_RDI;
  WidgetAttribute attribute;
  QWidget *this_01;
  
  this_01 = in_RDI;
  FVar2 = focusPolicy(in_RDI);
  if (FVar2 == NoFocus) {
    bVar1 = isWindow(in_RSI);
    attribute = (WidgetAttribute)((ulong)in_RSI >> 0x20);
    if (bVar1) goto LAB_0037d07b;
  }
  attribute = (WidgetAttribute)((ulong)in_RSI >> 0x20);
  update(in_RDI);
LAB_0037d07b:
  this_00 = QCoreApplication::instance();
  bVar1 = QApplication::autoSipEnabled((QApplication *)this_00);
  if ((bVar1) && (bVar1 = testAttribute(this_01,attribute), bVar1)) {
    QGuiApplication::inputMethod();
    QInputMethod::hide();
  }
  return;
}

Assistant:

void QWidget::focusOutEvent(QFocusEvent *)
{
    if (focusPolicy() != Qt::NoFocus || !isWindow())
        update();

#if !defined(QT_PLATFORM_UIKIT)
    // FIXME: revisit autoSIP logic, QTBUG-42906
    if (qApp->autoSipEnabled() && testAttribute(Qt::WA_InputMethodEnabled))
        QGuiApplication::inputMethod()->hide();
#endif
}